

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDTernary
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,SIMDTernary *curr)

{
  bool bVar1;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *pEVar2;
  Literal *pLVar3;
  Literal local_1c8;
  Literal local_1b0;
  Literal local_198;
  Literal local_180;
  Literal local_168;
  undefined1 local_150 [8];
  Literal c;
  undefined1 local_f0 [8];
  Literal b;
  undefined1 local_90 [8];
  Literal a;
  undefined1 local_68 [8];
  Flow flow;
  SIMDTernary *curr_local;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    a.type.id._0_4_ = 1;
  }
  else {
    pLVar3 = Flow::getSingleValue((Flow *)local_68);
    ::wasm::Literal::Literal((Literal *)local_90,pLVar3);
    pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
    visit((Flow *)&b.type,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x20));
    Flow::operator=((Flow *)local_68,(Flow *)&b.type);
    Flow::~Flow((Flow *)&b.type);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      a.type.id._0_4_ = 1;
    }
    else {
      pLVar3 = Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::Literal((Literal *)local_f0,pLVar3);
      pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
      visit((Flow *)&c.type,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x28));
      Flow::operator=((Flow *)local_68,(Flow *)&c.type);
      Flow::~Flow((Flow *)&c.type);
      bVar1 = Flow::breaking((Flow *)local_68);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
        a.type.id._0_4_ = 1;
      }
      else {
        pLVar3 = Flow::getSingleValue((Flow *)local_68);
        ::wasm::Literal::Literal((Literal *)local_150,pLVar3);
        switch(*(undefined4 *)(flow.breakTo.super_IString.str._M_str + 0x10)) {
        case 0:
        case 5:
        case 6:
        case 7:
        case 8:
          ::wasm::Literal::bitselectV128(&local_168,(Literal *)local_150);
          Flow::Flow(__return_storage_ptr__,&local_168);
          ::wasm::Literal::~Literal(&local_168);
          break;
        case 1:
          ::wasm::Literal::relaxedFmaF32x4(&local_180,(Literal *)local_90);
          Flow::Flow(__return_storage_ptr__,&local_180);
          ::wasm::Literal::~Literal(&local_180);
          break;
        case 2:
          ::wasm::Literal::relaxedFmsF32x4(&local_198,(Literal *)local_90);
          Flow::Flow(__return_storage_ptr__,&local_198);
          ::wasm::Literal::~Literal(&local_198);
          break;
        case 3:
          ::wasm::Literal::relaxedFmaF64x2(&local_1b0,(Literal *)local_90);
          Flow::Flow(__return_storage_ptr__,&local_1b0);
          ::wasm::Literal::~Literal(&local_1b0);
          break;
        case 4:
          ::wasm::Literal::relaxedFmsF64x2(&local_1c8,(Literal *)local_90);
          Flow::Flow(__return_storage_ptr__,&local_1c8);
          ::wasm::Literal::~Literal(&local_1c8);
          break;
        default:
          ::wasm::handle_unreachable
                    ("not implemented",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                     ,0x46a);
        }
        a.type.id._0_4_ = 1;
        ::wasm::Literal::~Literal((Literal *)local_150);
      }
      ::wasm::Literal::~Literal((Literal *)local_f0);
    }
    ::wasm::Literal::~Literal((Literal *)local_90);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDTernary(SIMDTernary* curr) {
    NOTE_ENTER("SIMDBitselect");
    Flow flow = self()->visit(curr->a);
    if (flow.breaking()) {
      return flow;
    }
    Literal a = flow.getSingleValue();
    flow = self()->visit(curr->b);
    if (flow.breaking()) {
      return flow;
    }
    Literal b = flow.getSingleValue();
    flow = self()->visit(curr->c);
    if (flow.breaking()) {
      return flow;
    }
    Literal c = flow.getSingleValue();
    switch (curr->op) {
      case Bitselect:
      case LaneselectI8x16:
      case LaneselectI16x8:
      case LaneselectI32x4:
      case LaneselectI64x2:
        return c.bitselectV128(a, b);

      case RelaxedFmaVecF32x4:
        return a.relaxedFmaF32x4(b, c);
      case RelaxedFmsVecF32x4:
        return a.relaxedFmsF32x4(b, c);
      case RelaxedFmaVecF64x2:
        return a.relaxedFmaF64x2(b, c);
      case RelaxedFmsVecF64x2:
        return a.relaxedFmsF64x2(b, c);
      default:
        // TODO: implement signselect and dot_add
        WASM_UNREACHABLE("not implemented");
    }
  }